

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O2

int tlv_data_get_name(uint8_t *data,size_t buflen,uint8_t **name,size_t *name_len)

{
  ulong in_RAX;
  uint8_t *puVar1;
  int iVar2;
  undefined8 local_38;
  uint32_t real_type;
  uint32_t real_len;
  
  local_38 = in_RAX;
  puVar1 = tlv_get_type_length(data,buflen,(uint32_t *)&local_38,(uint32_t *)((long)&local_38 + 4));
  iVar2 = -0xe;
  if (puVar1 != (uint8_t *)0x0) {
    if ((uint32_t)local_38 == 6) {
      if (data + (buflen - (long)puVar1) == (uint8_t *)(local_38 >> 0x20)) {
        *name = puVar1;
        puVar1 = tlv_get_type_length(puVar1,(size_t)(local_38 >> 0x20),(uint32_t *)&local_38,
                                     (uint32_t *)((long)&local_38 + 4));
        if (puVar1 != (uint8_t *)0x0) {
          if ((uint32_t)local_38 == 7) {
            *name_len = local_38 >> 0x20;
            iVar2 = 0;
          }
          else {
            iVar2 = -0x11;
          }
        }
      }
      else {
        iVar2 = -0xd;
      }
    }
    else {
      iVar2 = -0xc;
    }
  }
  return iVar2;
}

Assistant:

int
tlv_data_get_name(uint8_t* data,
                  size_t buflen,
                  uint8_t** name,
                  size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(data, buflen, &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Data){
    return NDN_WRONG_TLV_TYPE;
  }
  if(real_len != buflen - (ptr - data)){
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - data), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;

  return NDN_SUCCESS;
}